

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O3

bool __thiscall xercesc_4_0::XMLReader::skippedChar(XMLReader *this,XMLCh toSkip)

{
  bool bVar1;
  XMLSize_t XVar2;
  
  XVar2 = this->fCharIndex;
  if (XVar2 == this->fCharsAvail) {
    bVar1 = refreshCharBuffer(this);
    if (!bVar1) {
      return false;
    }
    XVar2 = this->fCharIndex;
  }
  if (this->fCharBuf[XVar2] != toSkip) {
    return false;
  }
  this->fCharIndex = XVar2 + 1;
  this->fCurCol = this->fCurCol + 1;
  return true;
}

Assistant:

bool XMLReader::skippedChar(const XMLCh toSkip)
{
    //
    //  If the buffer is empty, then try to reload it. If we still get
    //  nothing, then return false.
    //
    if (fCharIndex == fCharsAvail)
    {
        if (!refreshCharBuffer())
            return false;
    }

    //
    //  See if the current char is the one we want. If so, then we need
    //  to eat it and return true.
    //
    if (fCharBuf[fCharIndex] == toSkip)
    {
        fCharIndex++;
        fCurCol++;
        return true;
    }
    return false;
}